

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O2

void __thiscall QTextCursorPrivate::setX(QTextCursorPrivate *this)

{
  qreal qVar1;
  int iVar2;
  QTextLayout *this_00;
  int iVar3;
  long in_FS_OFFSET;
  undefined4 uVar4;
  undefined4 uVar5;
  QTextLine QVar6;
  undefined1 *local_48;
  QTextEngine *local_40;
  undefined1 *local_38;
  QTextDocumentPrivate *pQStack_30;
  qreal local_28;
  
  local_28 = *(qreal *)(in_FS_OFFSET + 0x28);
  if ((this->priv->editBlock == 0) && (this->priv->inContentsChange != true)) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_30 = (QTextDocumentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    block((QTextCursorPrivate *)&local_38);
    this_00 = blockLayout(this,(QTextBlock *)&local_38);
    iVar3 = this->position;
    iVar2 = QTextBlock::position((QTextBlock *)&local_38);
    iVar3 = iVar3 - iVar2;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    QVar6 = QTextLayout::lineForTextPosition(this_00,iVar3);
    local_40 = QVar6.eng;
    local_48 = (undefined1 *)CONCAT44(local_48._4_4_,QVar6.index);
    if (local_40 == (QTextEngine *)0x0) {
      uVar4 = 0;
      uVar5 = 0xbff00000;
    }
    else {
      qVar1 = QTextLine::cursorToX((QTextLine *)&local_48,iVar3,Leading);
      uVar4 = SUB84(qVar1,0);
      uVar5 = (undefined4)((ulong)qVar1 >> 0x20);
    }
    this->x = (qreal)CONCAT44(uVar5,uVar4);
  }
  else {
    this->x = -1.0;
  }
  if (*(qreal *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextCursorPrivate::setX()
{
    if (priv->isInEditBlock() || priv->inContentsChange) {
        x = -1; // mark dirty
        return;
    }

    QTextBlock block = this->block();
    const QTextLayout *layout = blockLayout(block);
    int pos = position - block.position();

    QTextLine line = layout->lineForTextPosition(pos);
    if (line.isValid())
        x = line.cursorToX(pos);
    else
        x = -1; // delayed init.  Makes movePosition() call setX later on again.
}